

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O2

int SUNLinSolSetATimes(SUNLinearSolver S,void *A_data,SUNATimesFn ATimes)

{
  _func_int_SUNLinearSolver_void_ptr_SUNATimesFn *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->setatimes;
  if (UNRECOVERED_JUMPTABLE != (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(S,A_data,ATimes);
    return iVar1;
  }
  return 0;
}

Assistant:

int SUNLinSolSetATimes(SUNLinearSolver S, void* A_data,
                       SUNATimesFn ATimes)
{
  int ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->setatimes)
    ier = S->ops->setatimes(S, A_data, ATimes);
  else
    ier = SUNLS_SUCCESS;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return(ier);
}